

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2beep.cpp
# Opt level: O1

void beep(int fre,int usDuration)

{
  byte bVar1;
  
  if (0 < fre) {
    out(0x43,0xb6);
    out(0x42,(char)(0x1234dc / (ulong)(uint)fre));
    out(0x42,(char)(0x1234dc / (ulong)(uint)fre >> 8));
  }
  bVar1 = in(0x61);
  if (0 < fre) {
    out(0x61,bVar1 | 3);
  }
  usleep(usDuration);
  out(0x61,bVar1 & 0xfc);
  return;
}

Assistant:

void beep(int fre, int usDuration)
{
    if (fre > 0) {
        int ff = 1193180/fre;
        outb( 0xB6,            0x43);
        outb( ff & 0xff,       0x42);
        outb((ff >> 8) & 0xff, 0x42);
    }

    int r = inb(0x61);
    if(fre > 0) outb(r|3, 0x61);
    usleep(usDuration);
    outb(r & 0xFC, 0x61);
}